

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_fixup_pass.cpp
# Opt level: O3

bool spvtools::opt::anon_unknown_0::ReplaceInternalInterpolate
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  uint *puVar1;
  uint *puVar2;
  array<signed_char,_4UL> aVar3;
  Op OVar4;
  array<signed_char,_4UL> aVar5;
  uint32_t uVar6;
  array<signed_char,_4UL> aVar7;
  array<signed_char,_4UL> aVar8;
  FeatureManager *pFVar9;
  Instruction *this;
  Instruction *this_00;
  uint uVar10;
  OperandList new_operands;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  pFVar9 = (ctx->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar9 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(ctx);
    pFVar9 = (ctx->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  aVar3._M_elems = (_Type)pFVar9->extinst_importid_GLSLstd450_;
  if (aVar3._M_elems == (_Type)0x0) {
    __assert_fail("glsl450_ext_inst_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interp_fixup_pass.cpp"
                  ,0x27,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceInternalInterpolate(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar10 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar10 = (uint)inst->has_result_id_;
  }
  aVar5._M_elems = (_Type)Instruction::GetSingleWordOperand(inst,uVar10 + 1);
  uVar10 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar10 = (uint)inst->has_result_id_;
  }
  uVar6 = Instruction::GetSingleWordOperand(inst,uVar10 + 2);
  if ((ctx->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(ctx);
  }
  this = analysis::DefUseManager::GetDef
                   ((ctx->def_use_mgr_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                    .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                    _M_head_impl,uVar6);
  OVar4 = this->opcode_;
  if (OVar4 == OpLoad) {
    this_00 = Instruction::GetBaseAddress(this);
    if (this_00->opcode_ == OpVariable) {
      uVar6 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar6 = (uint)this_00->has_result_id_;
      }
      uVar6 = Instruction::GetSingleWordOperand(this_00,uVar6);
      if (uVar6 == 1) {
        uVar6 = (this->has_result_id_ & 1) + 1;
        if (this->has_type_id_ == false) {
          uVar6 = (uint)this->has_result_id_;
        }
        aVar7._M_elems = (_Type)Instruction::GetSingleWordOperand(this,uVar6);
        aVar8._M_elems[0] = '\0';
        aVar8._M_elems[1] = '\0';
        aVar8._M_elems[2] = '\0';
        aVar8._M_elems[3] = '\0';
        if (aVar5._M_elems != (_Type)0x4c) {
          uVar10 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar10 = (uint)inst->has_result_id_;
          }
          aVar8._M_elems = (_Type)Instruction::GetSingleWordOperand(inst,uVar10 + 3);
        }
        local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a0._24_8_ = local_a0 + 0x10;
        local_a0._0_8_ = &PTR__SmallVector_003d7c78;
        local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_a0._8_8_ = 1;
        local_78._0_4_ = SPV_OPERAND_TYPE_ID;
        local_78._8_8_ = &PTR__SmallVector_003d7c78;
        local_78._16_8_ = 0;
        local_78._32_8_ = local_78 + 0x18;
        local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_a0._16_4_ = aVar3._M_elems;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)(local_78 + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_a0);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_78);
        local_78._8_8_ = &PTR__SmallVector_003d7c78;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_50,local_50._M_head_impl);
        }
        local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_a0._0_8_ = &PTR__SmallVector_003d7c78;
        if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_80,local_80._M_head_impl);
        }
        local_a0._0_8_ = &PTR__SmallVector_003d7c78;
        puVar1 = (uint *)(local_a0 + 0x10);
        local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_a0._8_8_ = 1;
        local_78._0_4_ = SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER;
        local_78._8_8_ = &PTR__SmallVector_003d7c78;
        local_78._16_8_ = 0;
        puVar2 = (uint *)(local_78 + 0x18);
        local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_a0._16_4_ = aVar5._M_elems;
        local_a0._24_8_ = puVar1;
        local_78._32_8_ = puVar2;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)(local_78 + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_a0);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_78);
        local_78._8_8_ = &PTR__SmallVector_003d7c78;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_50,local_50._M_head_impl);
        }
        local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_a0._0_8_ = &PTR__SmallVector_003d7c78;
        if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_80,local_80._M_head_impl);
        }
        local_a0._0_8_ = &PTR__SmallVector_003d7c78;
        local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_a0._8_8_ = 1;
        local_78._0_4_ = SPV_OPERAND_TYPE_ID;
        local_78._8_8_ = &PTR__SmallVector_003d7c78;
        local_78._16_8_ = 0;
        local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_a0._16_4_ = aVar7._M_elems;
        local_a0._24_8_ = puVar1;
        local_78._32_8_ = puVar2;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)(local_78 + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_a0);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_78);
        local_78._8_8_ = &PTR__SmallVector_003d7c78;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_50,local_50._M_head_impl);
        }
        local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_a0._0_8_ = &PTR__SmallVector_003d7c78;
        if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_80,local_80._M_head_impl);
        }
        if (aVar8._M_elems != (_Type)0x0) {
          local_a0._0_8_ = &PTR__SmallVector_003d7c78;
          local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a0._8_8_ = 1;
          local_78._0_4_ = SPV_OPERAND_TYPE_ID;
          local_78._8_8_ = &PTR__SmallVector_003d7c78;
          local_78._16_8_ = 0;
          local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a0._16_4_ = aVar8._M_elems;
          local_a0._24_8_ = puVar1;
          local_78._32_8_ = puVar2;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_78 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_a0);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_78);
          local_78._8_8_ = &PTR__SmallVector_003d7c78;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
          {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_50,local_50._M_head_impl);
          }
          local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a0._0_8_ = &PTR__SmallVector_003d7c78;
          if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_80,local_80._M_head_impl);
          }
        }
        uVar10 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar10 = (uint)inst->has_result_id_;
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                  (&inst->operands_,
                   (Operand *)
                   ((long)((((inst->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                          0xfffffffffffffffa) + (ulong)(uVar10 * 0x30)),
                   (inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &inst->operands_,
                   (inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_48.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_48.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        if ((ctx->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
          analysis::DefUseManager::UpdateDefUse
                    ((ctx->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,inst);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_48);
        goto LAB_0023330c;
      }
    }
    __assert_fail("base_inst->opcode() == spv::Op::OpVariable && spv::StorageClass(base_inst->GetSingleWordInOperand( kSpvVariableStorageClassInIdx)) == spv::StorageClass::Input && \"unexpected interpolant in InterpolateAt*\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interp_fixup_pass.cpp"
                  ,0x34,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceInternalInterpolate(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
LAB_0023330c:
  return OVar4 == OpLoad;
}

Assistant:

bool ReplaceInternalInterpolate(IRContext* ctx, Instruction* inst,
                                const std::vector<const analysis::Constant*>&) {
  uint32_t glsl450_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  assert(glsl450_ext_inst_id != 0);

  uint32_t ext_opcode = inst->GetSingleWordInOperand(1);

  uint32_t op1_id = inst->GetSingleWordInOperand(2);

  Instruction* load_inst = ctx->get_def_use_mgr()->GetDef(op1_id);
  if (load_inst->opcode() != spv::Op::OpLoad) return false;

  Instruction* base_inst = load_inst->GetBaseAddress();
  USE_ASSERT(base_inst->opcode() == spv::Op::OpVariable &&
             spv::StorageClass(base_inst->GetSingleWordInOperand(
                 kSpvVariableStorageClassInIdx)) == spv::StorageClass::Input &&
             "unexpected interpolant in InterpolateAt*");

  uint32_t ptr_id = load_inst->GetSingleWordInOperand(0);
  uint32_t op2_id = (ext_opcode != GLSLstd450InterpolateAtCentroid)
                        ? inst->GetSingleWordInOperand(3)
                        : 0;

  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {glsl450_ext_inst_id}});
  new_operands.push_back(
      {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {ext_opcode}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {ptr_id}});
  if (op2_id != 0) new_operands.push_back({SPV_OPERAND_TYPE_ID, {op2_id}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}